

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O1

ChVector<double> * __thiscall
chrono::ChFrameMoving<double>::PointAccelerationLocalToParent
          (ChFrameMoving<double> *this,ChVector<double> *localpos,ChVector<double> *localspeed,
          ChVector<double> *localacc)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ChVector<double> *in_RDI;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  
  auVar13._8_8_ = 0;
  auVar13._0_8_ = localacc->m_data[0];
  dVar1 = localacc->m_data[1];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (this->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       dVar1 * *(double *)
                ((long)(this->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array + 8);
  auVar7 = vfmadd231sd_fma(auVar17,auVar13,auVar7);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = localacc->m_data[2];
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       *(double *)
        ((long)(this->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x10);
  auVar7 = vfmadd231sd_fma(auVar7,auVar19,auVar14);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(double *)
                  ((long)(this->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 0x18);
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       dVar1 * *(double *)
                ((long)(this->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array + 0x20);
  auVar14 = vfmadd231sd_fma(auVar25,auVar13,auVar8);
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       *(double *)
        ((long)(this->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x28);
  auVar14 = vfmadd231sd_fma(auVar14,auVar19,auVar12);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(double *)
                  ((long)(this->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 0x30);
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       dVar1 * *(double *)
                ((long)(this->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array + 0x38);
  auVar8 = vfmadd231sd_fma(auVar15,auVar13,auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       *(double *)
        ((long)(this->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x40);
  auVar8 = vfmadd231sd_fma(auVar8,auVar19,auVar10);
  dVar1 = (this->coord_dtdt).pos.m_data[0];
  dVar2 = (this->coord_dtdt).pos.m_data[2];
  auVar30._8_8_ = 0;
  auVar30._0_8_ = localpos->m_data[0];
  auVar29._8_8_ = 0;
  auVar29._0_8_ = localpos->m_data[1];
  auVar27._8_8_ = 0;
  auVar27._0_8_ = localpos->m_data[2];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = (this->coord_dtdt).rot.m_data[0];
  dVar3 = (this->coord_dtdt).rot.m_data[1];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar3;
  auVar19 = ZEXT816(0) << 0x40;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = localpos->m_data[0] * dVar3;
  auVar12 = vfmsub231sd_fma(auVar37,auVar11,auVar19);
  dVar4 = (this->coord_dtdt).rot.m_data[2];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar4;
  auVar12 = vfnmadd231sd_fma(auVar12,auVar18,auVar29);
  dVar5 = (this->coord_dtdt).rot.m_data[3];
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar5;
  auVar13 = vfnmadd231sd_fma(auVar12,auVar23,auVar27);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar3 * 0.0;
  auVar12 = vfmadd231sd_fma(auVar39,auVar11,auVar30);
  auVar12 = vfnmadd231sd_fma(auVar12,auVar23,auVar29);
  auVar12 = vfmadd231sd_fma(auVar12,auVar18,auVar27);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar4 * 0.0;
  auVar9 = vfmadd231sd_fma(auVar41,auVar11,auVar29);
  auVar9 = vfmadd231sd_fma(auVar9,auVar23,auVar30);
  auVar15 = vfnmadd231sd_fma(auVar9,auVar16,auVar27);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar5 * 0.0;
  auVar9 = vfmadd231sd_fma(auVar43,auVar27,auVar11);
  auVar9 = vfnmadd231sd_fma(auVar9,auVar30,auVar18);
  auVar9 = vfmadd231sd_fma(auVar9,auVar29,auVar16);
  dVar3 = (this->super_ChFrame<double>).coord.rot.m_data[0];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar3;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = (this->super_ChFrame<double>).coord.rot.m_data[1];
  auVar20._8_8_ = 0;
  auVar20._0_8_ = (this->super_ChFrame<double>).coord.rot.m_data[2];
  auVar24._8_8_ = 0;
  auVar24._0_8_ = (this->super_ChFrame<double>).coord.rot.m_data[3];
  auVar46._8_8_ = 0;
  auVar46._0_8_ = auVar12._0_8_ * dVar3;
  auVar10 = vfnmadd231sd_fma(auVar46,auVar13,auVar21);
  auVar10 = vfmadd231sd_fma(auVar10,auVar9,auVar20);
  auVar10 = vfnmadd231sd_fma(auVar10,auVar15,auVar24);
  auVar11 = vmulsd_avx512f(auVar22,auVar15);
  auVar11 = vfnmadd231sd_avx512f(auVar11,auVar13,auVar20);
  auVar11 = vfnmadd231sd_avx512f(auVar11,auVar9,auVar21);
  auVar11 = vfmadd231sd_avx512f(auVar11,auVar12,auVar24);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = auVar9._0_8_ * dVar3;
  auVar9 = vfnmadd231sd_fma(auVar44,auVar24,auVar13);
  auVar9 = vfmadd231sd_fma(auVar9,auVar21,auVar15);
  auVar9 = vfnmadd231sd_fma(auVar9,auVar20,auVar12);
  auVar12 = vaddsd_avx512f(auVar11,auVar11);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = auVar14._0_8_ + (this->coord_dtdt).pos.m_data[1];
  auVar13 = vaddsd_avx512f(auVar33,auVar12);
  dVar4 = (this->coord_dt).rot.m_data[0];
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar4;
  dVar5 = (this->coord_dt).rot.m_data[1];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar5;
  auVar14 = vmulsd_avx512f(auVar30,auVar35);
  auVar14 = vfmsub231sd_avx512f(auVar14,auVar38,auVar19);
  dVar6 = (this->coord_dt).rot.m_data[2];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar6;
  auVar14 = vfnmadd231sd_avx512f(auVar14,auVar40,auVar29);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = (this->coord_dt).rot.m_data[3];
  auVar15 = vfnmadd231sd_avx512f(auVar14,auVar42,auVar27);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar5 * 0.0;
  auVar14 = vfmadd213sd_avx512f(auVar30,auVar38,auVar32);
  auVar14 = vfnmadd231sd_avx512f(auVar14,auVar42,auVar29);
  auVar11 = vfmadd231sd_avx512f(auVar14,auVar40,auVar27);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar6 * 0.0;
  auVar14 = vfmadd213sd_avx512f(auVar29,auVar38,auVar34);
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar42,auVar30);
  auVar16 = vfnmadd231sd_avx512f(auVar14,auVar35,auVar27);
  auVar17 = vmulsd_avx512f(auVar42,auVar19);
  auVar14 = vfmadd213sd_avx512f(auVar27,auVar38,auVar17);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar40,auVar30);
  auVar14 = vfmadd231sd_fma(auVar14,auVar35,auVar29);
  auVar12 = vmulsd_avx512f(auVar38,auVar11);
  auVar12 = vfnmadd231sd_avx512f(auVar12,auVar15,auVar35);
  auVar12 = vfmadd231sd_fma(auVar12,auVar14,auVar40);
  auVar18 = vfnmadd231sd_avx512f(auVar12,auVar16,auVar42);
  auVar12 = vmulsd_avx512f(auVar38,auVar16);
  auVar12 = vfnmadd231sd_avx512f(auVar12,auVar15,auVar40);
  auVar12 = vfnmadd231sd_fma(auVar12,auVar14,auVar35);
  auVar12 = vfmadd231sd_avx512f(auVar12,auVar11,auVar42);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar4 * auVar14._0_8_;
  auVar14 = vfnmadd231sd_avx512f(auVar28,auVar42,auVar15);
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar35,auVar16);
  auVar15 = vfnmadd231sd_avx512f(auVar14,auVar40,auVar11);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = auVar12._0_8_ + auVar12._0_8_;
  auVar11 = vaddsd_avx512f(auVar13,auVar31);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = localspeed->m_data[0];
  auVar47._8_8_ = 0;
  auVar47._0_8_ = localspeed->m_data[1];
  auVar14 = vmulsd_avx512f(auVar45,auVar35);
  auVar14 = vfmsub231sd_avx512f(auVar14,auVar38,auVar19);
  auVar14 = vfnmadd231sd_avx512f(auVar14,auVar40,auVar47);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = localspeed->m_data[2];
  auVar12 = vfnmadd231sd_avx512f(auVar14,auVar42,auVar48);
  auVar14 = vfmadd231sd_fma(auVar32,auVar38,auVar45);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar42,auVar47);
  auVar16 = vfmadd231sd_avx512f(auVar14,auVar40,auVar48);
  auVar14 = vfmadd231sd_fma(auVar34,auVar38,auVar47);
  auVar14 = vfmadd231sd_fma(auVar14,auVar45,auVar42);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = localspeed->m_data[2];
  auVar19 = vfnmadd231sd_avx512f(auVar14,auVar35,auVar49);
  auVar14 = vfmadd213sd_avx512f(auVar49,auVar38,auVar17);
  auVar14 = vfnmadd231sd_avx512f(auVar14,auVar40,auVar45);
  auVar17 = vfmadd231sd_avx512f(auVar14,auVar35,auVar47);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = auVar16._0_8_ * dVar3;
  auVar14 = vfnmadd231sd_avx512f(auVar26,auVar12,auVar21);
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar17,auVar20);
  auVar13 = vfnmadd231sd_fma(auVar14,auVar19,auVar24);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = auVar19._0_8_ * dVar3;
  auVar14 = vfnmadd231sd_avx512f(auVar36,auVar12,auVar20);
  auVar14 = vfnmadd231sd_avx512f(auVar14,auVar17,auVar21);
  auVar14 = vfmadd231sd_fma(auVar14,auVar16,auVar24);
  auVar17 = vmulsd_avx512f(auVar22,auVar17);
  auVar12 = vfnmadd231sd_avx512f(auVar17,auVar24,auVar12);
  auVar12 = vfmadd231sd_fma(auVar12,auVar21,auVar19);
  auVar12 = vfnmadd231sd_fma(auVar12,auVar20,auVar16);
  in_RDI->m_data[0] = 0.0;
  in_RDI->m_data[1] = 0.0;
  in_RDI->m_data[0] =
       auVar7._0_8_ + dVar1 + auVar10._0_8_ + auVar10._0_8_ + auVar18._0_8_ + auVar18._0_8_ +
       auVar13._0_8_ * 4.0;
  in_RDI->m_data[1] = auVar11._0_8_ + auVar14._0_8_ * 4.0;
  in_RDI->m_data[2] =
       auVar8._0_8_ + dVar2 + auVar9._0_8_ + auVar9._0_8_ + auVar15._0_8_ + auVar15._0_8_ +
       auVar12._0_8_ * 4.0;
  return in_RDI;
}

Assistant:

ChVector<Real> PointAccelerationLocalToParent(const ChVector<Real>& localpos,
                                                  const ChVector<Real>& localspeed,
                                                  const ChVector<Real>& localacc) const {
        return coord_dtdt.pos + this->Amatrix * localacc +
               ((coord_dtdt.rot % ChQuaternion<Real>(0, localpos) % this->coord.rot.GetConjugate()).GetVector() * 2) +
               ((coord_dt.rot % ChQuaternion<Real>(0, localpos) % coord_dt.rot.GetConjugate()).GetVector() * 2) +
               ((coord_dt.rot % ChQuaternion<Real>(0, localspeed) % this->coord.rot.GetConjugate()).GetVector() * 4);
    }